

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  char *pcVar1;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar2;
  Module *this_00;
  Offset OVar3;
  size_t sVar4;
  StartModuleField *pSVar5;
  Var start;
  Location loc;
  _Head_base<0UL,_wabt::StartModuleField_*,_false> local_c8;
  Var local_c0;
  Var local_78;
  
  pcVar1 = this->filename_;
  aVar2.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_78.loc.field_1.field_0.last_column = 0;
  local_78.loc.filename._M_len = strlen(pcVar1);
  local_78.loc.filename._M_str = pcVar1;
  local_78.loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar2.offset;
  Var::Var(&local_c0,func_index,&local_78.loc);
  this_00 = this->module_;
  pcVar1 = this->filename_;
  OVar3 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar4 = strlen(pcVar1);
  pSVar5 = (StartModuleField *)operator_new(0x88);
  Var::Var(&local_78,&local_c0);
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
  super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.filename._M_len =
       sVar4;
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.filename._M_str =
       pcVar1;
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.field_1.field_1.
  offset = OVar3;
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.loc.field_1.field_0.
  last_column = 0;
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.type_ = Start;
  (pSVar5->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__StartModuleField_00221330;
  Var::Var(&pSVar5->start,&local_78);
  local_c8._M_head_impl = pSVar5;
  Var::~Var(&local_78);
  Module::AppendField(this_00,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                               *)&local_c8);
  if (local_c8._M_head_impl != (StartModuleField *)0x0) {
    (*((local_c8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)9>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_c8._M_head_impl = (StartModuleField *)0x0;
  Var::~Var(&local_c0);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  Var start(func_index, GetLocation());
  module_->AppendField(
      std::make_unique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}